

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O1

int I420Blend(uint8_t *src_y0,int src_stride_y0,uint8_t *src_u0,int src_stride_u0,uint8_t *src_v0,
             int src_stride_v0,uint8_t *src_y1,int src_stride_y1,uint8_t *src_u1,int src_stride_u1,
             uint8_t *src_v1,int src_stride_v1,uint8_t *alpha,int alpha_stride,uint8_t *dst_y,
             int dst_stride_y,uint8_t *dst_u,int dst_stride_u,uint8_t *dst_v,int dst_stride_v,
             int width,int height)

{
  uint uVar1;
  void *__ptr;
  int iVar2;
  int iVar3;
  code *pcVar4;
  int iVar5;
  ulong uVar6;
  code *pcVar7;
  uint uVar8;
  code *pcVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  auVar14._0_4_ = -(uint)((int)alpha == 0);
  auVar14._4_4_ = -(uint)((int)((ulong)alpha >> 0x20) == 0);
  auVar14._8_4_ = -(uint)((int)dst_y == 0);
  auVar14._12_4_ = -(uint)((int)((ulong)dst_y >> 0x20) == 0);
  auVar17._4_4_ = auVar14._0_4_;
  auVar17._0_4_ = auVar14._4_4_;
  auVar17._8_4_ = auVar14._12_4_;
  auVar17._12_4_ = auVar14._8_4_;
  auVar16._0_4_ = -(uint)((int)src_u1 == 0);
  auVar16._4_4_ = -(uint)((int)((ulong)src_u1 >> 0x20) == 0);
  auVar16._8_4_ = -(uint)((int)src_v1 == 0);
  auVar16._12_4_ = -(uint)((int)((ulong)src_v1 >> 0x20) == 0);
  auVar15._4_4_ = auVar16._0_4_;
  auVar15._0_4_ = auVar16._4_4_;
  auVar15._8_4_ = auVar16._12_4_;
  auVar15._12_4_ = auVar16._8_4_;
  auVar16 = packssdw(auVar15 & auVar16,auVar17 & auVar14);
  auVar12._0_4_ = -(uint)((int)src_v0 == 0);
  auVar12._4_4_ = -(uint)((int)((ulong)src_v0 >> 0x20) == 0);
  auVar12._8_4_ = -(uint)((int)src_y1 == 0);
  auVar12._12_4_ = -(uint)((int)((ulong)src_y1 >> 0x20) == 0);
  auVar13._4_4_ = auVar12._0_4_;
  auVar13._0_4_ = auVar12._4_4_;
  auVar13._8_4_ = auVar12._12_4_;
  auVar13._12_4_ = auVar12._8_4_;
  auVar11._0_4_ = -(uint)((int)src_y0 == 0);
  auVar11._4_4_ = -(uint)((int)((ulong)src_y0 >> 0x20) == 0);
  auVar11._8_4_ = -(uint)((int)src_u0 == 0);
  auVar11._12_4_ = -(uint)((int)((ulong)src_u0 >> 0x20) == 0);
  auVar10._4_4_ = auVar11._0_4_;
  auVar10._0_4_ = auVar11._4_4_;
  auVar10._8_4_ = auVar11._12_4_;
  auVar10._12_4_ = auVar11._8_4_;
  auVar11 = packssdw(auVar10 & auVar11,auVar13 & auVar12);
  auVar11 = packssdw(auVar11,auVar16);
  iVar5 = -1;
  if ((height != 0 && (0 < width && (dst_v != (uint8_t *)0x0 && dst_u != (uint8_t *)0x0))) &&
      ((((((((auVar11 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar11 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar11 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar11 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar11 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar11 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar11 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar11[0xf])) {
    iVar5 = height;
    if (height < 0) {
      iVar5 = -height;
      dst_y = dst_y + ~height * dst_stride_y;
      dst_stride_y = -dst_stride_y;
    }
    uVar8 = width + 1;
    BlendPlane(src_y0,src_stride_y0,src_y1,src_stride_y1,alpha,alpha_stride,dst_y,dst_stride_y,width
               ,iVar5);
    uVar1 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar1 = InitCpuFlags();
    }
    if ((uVar8 & 0xe) == 0) {
      pcVar7 = BlendPlaneRow_SSSE3;
    }
    else {
      pcVar7 = BlendPlaneRow_Any_SSSE3;
    }
    if ((uVar1 & 0x40) == 0) {
      pcVar7 = BlendPlaneRow_C;
    }
    uVar1 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar1 = InitCpuFlags();
    }
    if ((uVar8 & 0x3e) == 0) {
      pcVar9 = BlendPlaneRow_AVX2;
    }
    else {
      pcVar9 = BlendPlaneRow_Any_AVX2;
    }
    if ((uVar1 >> 10 & 1) == 0) {
      pcVar9 = pcVar7;
    }
    if ((width & 1U) == 0) {
      pcVar7 = ScaleRowDown2Box_C;
    }
    else {
      pcVar7 = ScaleRowDown2Box_Odd_C;
    }
    uVar1 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar1 = InitCpuFlags();
    }
    if ((uVar8 & 0x1e) == 0) {
      pcVar4 = ScaleRowDown2Box_SSSE3;
    }
    else {
      pcVar4 = ScaleRowDown2Box_Any_SSSE3;
    }
    if ((width & 1U) != 0) {
      pcVar4 = ScaleRowDown2Box_Odd_SSSE3;
    }
    if ((uVar1 & 0x40) == 0) {
      pcVar4 = pcVar7;
    }
    uVar1 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar1 = InitCpuFlags();
    }
    if ((uVar8 & 0x3e) == 0) {
      pcVar7 = ScaleRowDown2Box_AVX2;
    }
    else {
      pcVar7 = ScaleRowDown2Box_Any_AVX2;
    }
    iVar2 = (int)uVar8 >> 1;
    if ((width & 1U) != 0) {
      pcVar7 = ScaleRowDown2Box_Odd_AVX2;
    }
    if ((uVar1 >> 10 & 1) == 0) {
      pcVar7 = pcVar4;
    }
    __ptr = malloc((ulong)(iVar2 + 0x3f));
    if (0 < iVar5) {
      uVar6 = (long)__ptr + 0x3fU & 0xffffffffffffffc0;
      iVar3 = 0;
      do {
        if (iVar5 + -1 == iVar3) {
          alpha_stride = 0;
        }
        (*pcVar7)(alpha,(long)alpha_stride,uVar6,iVar2);
        alpha = alpha + alpha_stride * 2;
        (*pcVar9)(src_u0,src_u1,uVar6,dst_u,iVar2);
        (*pcVar9)(src_v0,src_v1,uVar6,dst_v,iVar2);
        src_u0 = src_u0 + src_stride_u0;
        src_u1 = src_u1 + src_stride_u1;
        dst_u = dst_u + dst_stride_u;
        src_v0 = src_v0 + src_stride_v0;
        src_v1 = src_v1 + src_stride_v1;
        dst_v = dst_v + dst_stride_v;
        iVar3 = iVar3 + 2;
      } while (iVar3 < iVar5);
    }
    free(__ptr);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

LIBYUV_API
int I420Blend(const uint8_t* src_y0,
              int src_stride_y0,
              const uint8_t* src_u0,
              int src_stride_u0,
              const uint8_t* src_v0,
              int src_stride_v0,
              const uint8_t* src_y1,
              int src_stride_y1,
              const uint8_t* src_u1,
              int src_stride_u1,
              const uint8_t* src_v1,
              int src_stride_v1,
              const uint8_t* alpha,
              int alpha_stride,
              uint8_t* dst_y,
              int dst_stride_y,
              uint8_t* dst_u,
              int dst_stride_u,
              uint8_t* dst_v,
              int dst_stride_v,
              int width,
              int height) {
  int y;
  // Half width/height for UV.
  int halfwidth = (width + 1) >> 1;
  void (*BlendPlaneRow)(const uint8_t* src0, const uint8_t* src1,
                        const uint8_t* alpha, uint8_t* dst, int width) =
      BlendPlaneRow_C;
  void (*ScaleRowDown2)(const uint8_t* src_ptr, ptrdiff_t src_stride,
                        uint8_t* dst_ptr, int dst_width) = ScaleRowDown2Box_C;
  if (!src_y0 || !src_u0 || !src_v0 || !src_y1 || !src_u1 || !src_v1 ||
      !alpha || !dst_y || !dst_u || !dst_v || width <= 0 || height == 0) {
    return -1;
  }

  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_y = dst_y + (height - 1) * dst_stride_y;
    dst_stride_y = -dst_stride_y;
  }

  // Blend Y plane.
  BlendPlane(src_y0, src_stride_y0, src_y1, src_stride_y1, alpha, alpha_stride,
             dst_y, dst_stride_y, width, height);

#if defined(HAS_BLENDPLANEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    BlendPlaneRow = BlendPlaneRow_Any_SSSE3;
    if (IS_ALIGNED(halfwidth, 8)) {
      BlendPlaneRow = BlendPlaneRow_SSSE3;
    }
  }
#endif
#if defined(HAS_BLENDPLANEROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    BlendPlaneRow = BlendPlaneRow_Any_AVX2;
    if (IS_ALIGNED(halfwidth, 32)) {
      BlendPlaneRow = BlendPlaneRow_AVX2;
    }
  }
#endif
#if defined(HAS_BLENDPLANEROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    BlendPlaneRow = BlendPlaneRow_Any_MMI;
    if (IS_ALIGNED(halfwidth, 8)) {
      BlendPlaneRow = BlendPlaneRow_MMI;
    }
  }
#endif
  if (!IS_ALIGNED(width, 2)) {
    ScaleRowDown2 = ScaleRowDown2Box_Odd_C;
  }
#if defined(HAS_SCALEROWDOWN2_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ScaleRowDown2 = ScaleRowDown2Box_Odd_NEON;
    if (IS_ALIGNED(width, 2)) {
      ScaleRowDown2 = ScaleRowDown2Box_Any_NEON;
      if (IS_ALIGNED(halfwidth, 16)) {
        ScaleRowDown2 = ScaleRowDown2Box_NEON;
      }
    }
  }
#endif
#if defined(HAS_SCALEROWDOWN2_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    ScaleRowDown2 = ScaleRowDown2Box_Odd_SSSE3;
    if (IS_ALIGNED(width, 2)) {
      ScaleRowDown2 = ScaleRowDown2Box_Any_SSSE3;
      if (IS_ALIGNED(halfwidth, 16)) {
        ScaleRowDown2 = ScaleRowDown2Box_SSSE3;
      }
    }
  }
#endif
#if defined(HAS_SCALEROWDOWN2_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    ScaleRowDown2 = ScaleRowDown2Box_Odd_AVX2;
    if (IS_ALIGNED(width, 2)) {
      ScaleRowDown2 = ScaleRowDown2Box_Any_AVX2;
      if (IS_ALIGNED(halfwidth, 32)) {
        ScaleRowDown2 = ScaleRowDown2Box_AVX2;
      }
    }
  }
#endif
#if defined(HAS_SCALEROWDOWN2_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ScaleRowDown2 = ScaleRowDown2Box_Odd_MMI;
    if (IS_ALIGNED(width, 2)) {
      ScaleRowDown2 = ScaleRowDown2Box_Any_MMI;
      if (IS_ALIGNED(halfwidth, 8)) {
        ScaleRowDown2 = ScaleRowDown2Box_MMI;
      }
    }
  }
#endif

  // Row buffer for intermediate alpha pixels.
  align_buffer_64(halfalpha, halfwidth);
  for (y = 0; y < height; y += 2) {
    // last row of odd height image use 1 row of alpha instead of 2.
    if (y == (height - 1)) {
      alpha_stride = 0;
    }
    // Subsample 2 rows of UV to half width and half height.
    ScaleRowDown2(alpha, alpha_stride, halfalpha, halfwidth);
    alpha += alpha_stride * 2;
    BlendPlaneRow(src_u0, src_u1, halfalpha, dst_u, halfwidth);
    BlendPlaneRow(src_v0, src_v1, halfalpha, dst_v, halfwidth);
    src_u0 += src_stride_u0;
    src_u1 += src_stride_u1;
    dst_u += dst_stride_u;
    src_v0 += src_stride_v0;
    src_v1 += src_stride_v1;
    dst_v += dst_stride_v;
  }
  free_aligned_buffer_64(halfalpha);
  return 0;
}